

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void * __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this,size_t Size,
          size_t Alignment)

{
  size_t sVar1;
  void *Addr;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  ulong Sz;
  pair<void_*,_unsigned_long> local_38;
  
  if (Alignment == 0) {
    __assert_fail("Alignment > 0 && \"0-byte alignnment is not allowed. Use 1 instead.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xd8,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  this->BytesAllocated = this->BytesAllocated + Size;
  sVar1 = alignmentAdjustment(this->CurPtr,Alignment);
  if (CARRY8(sVar1,Size)) {
    __assert_fail("Adjustment + Size >= Size && \"Adjustment + Size must not overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xde,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  if ((ulong)((long)this->End - (long)this->CurPtr) < sVar1 + Size) {
    Sz = (Size + Alignment) - 1;
    if (0x1000 < Sz) {
      Addr = safe_malloc(Sz);
      local_38.first = Addr;
      local_38.second = Sz;
      SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>::push_back
                ((SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true> *)
                 &this->CustomSizedSlabs,&local_38);
      pvVar2 = (void *)alignAddr(Addr,Alignment);
      if (Size + (long)pvVar2 <= Sz + (long)Addr) {
        return pvVar2;
      }
      __assert_fail("AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                    ,0xfd,
                    "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                   );
    }
    StartNewSlab(this);
    pcVar3 = (char *)alignAddr(this->CurPtr,Alignment);
    pcVar4 = pcVar3 + Size;
    if (this->End < pcVar4) {
      __assert_fail("AlignedAddr + SizeToAllocate <= (uintptr_t)End && \"Unable to allocate memory!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                    ,0x108,
                    "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                   );
    }
  }
  else {
    pcVar3 = this->CurPtr + sVar1;
    pcVar4 = pcVar3 + Size;
  }
  this->CurPtr = pcVar4;
  return pcVar3;
}

Assistant:

void *
  Allocate(size_t Size, size_t Alignment) {
    assert(Alignment > 0 && "0-byte alignnment is not allowed. Use 1 instead.");

    // Keep track of how many bytes we've allocated.
    BytesAllocated += Size;

    size_t Adjustment = alignmentAdjustment(CurPtr, Alignment);
    assert(Adjustment + Size >= Size && "Adjustment + Size must not overflow");

    size_t SizeToAllocate = Size;
#if LLVM_ADDRESS_SANITIZER_BUILD
    // Add trailing bytes as a "red zone" under ASan.
    SizeToAllocate += RedZoneSize;
#endif

    // Check if we have enough space.
    if (Adjustment + SizeToAllocate <= size_t(End - CurPtr)) {
      char *AlignedPtr = CurPtr + Adjustment;
      CurPtr = AlignedPtr + SizeToAllocate;
      // Update the allocation point of this memory block in MemorySanitizer.
      // Without this, MemorySanitizer messages for values originated from here
      // will point to the allocation of the entire slab.
      __msan_allocated_memory(AlignedPtr, Size);
      // Similarly, tell ASan about this space.
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // If Size is really big, allocate a separate slab for it.
    size_t PaddedSize = SizeToAllocate + Alignment - 1;
    if (PaddedSize > SizeThreshold) {
      void *NewSlab = Allocator.Allocate(PaddedSize, 0);
      // We own the new slab and don't want anyone reading anyting other than
      // pieces returned from this method.  So poison the whole slab.
      __asan_poison_memory_region(NewSlab, PaddedSize);
      CustomSizedSlabs.push_back(std::make_pair(NewSlab, PaddedSize));

      uintptr_t AlignedAddr = alignAddr(NewSlab, Alignment);
      assert(AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize);
      char *AlignedPtr = (char*)AlignedAddr;
      __msan_allocated_memory(AlignedPtr, Size);
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // Otherwise, start a new slab and try again.
    StartNewSlab();
    uintptr_t AlignedAddr = alignAddr(CurPtr, Alignment);
    assert(AlignedAddr + SizeToAllocate <= (uintptr_t)End &&
           "Unable to allocate memory!");
    char *AlignedPtr = (char*)AlignedAddr;
    CurPtr = AlignedPtr + SizeToAllocate;
    __msan_allocated_memory(AlignedPtr, Size);
    __asan_unpoison_memory_region(AlignedPtr, Size);
    return AlignedPtr;
  }